

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O3

void __thiscall pybind11::array::array<int>(array *this,ssize_t count,int *ptr,handle base)

{
  allocator_type local_61;
  ssize_t local_60;
  StridesContainer local_58;
  void *local_38 [2];
  long local_28;
  
  local_60 = count;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)local_38,&local_60,(long *)&local_58,&local_61);
  local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  array<int>(this,(ShapeContainer *)local_38,&local_58,ptr,base);
  if (local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38[0] != (void *)0x0) {
    operator_delete(local_38[0],local_28 - (long)local_38[0]);
  }
  return;
}

Assistant:

explicit array(ssize_t count, const T *ptr, handle base = handle())
        : array({count}, {}, ptr, base) {}